

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::LRN_x86_fma::forward_inplace(LRN_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  void *pvVar3;
  undefined1 auVar4 [32];
  float fVar5;
  float fVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int *piVar11;
  pointer piVar12;
  Mat *pMVar13;
  Mat *pMVar14;
  int k;
  Mat *pMVar15;
  ulong uVar16;
  uint top;
  ulong uVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  undefined1 (*pauVar23) [32];
  _func_int ***ppp_Var24;
  float *pfVar25;
  _func_int ***ppp_Var26;
  int j;
  int iVar27;
  uint uVar28;
  int q;
  void *pvVar29;
  int iVar30;
  int iVar31;
  float fVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  allocator_type local_1a9;
  Mat *local_1a8;
  LRN_x86_fma *local_1a0;
  Mat local_198;
  Mat *local_150;
  _func_int ***local_148;
  Mat *local_140;
  undefined1 local_138 [16];
  Mat local_128;
  undefined1 local_d8 [32];
  Allocator *local_b0;
  void *local_a8;
  long local_a0;
  long local_98;
  Mat *local_90;
  long local_88;
  long local_80;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  auVar4 = local_d8;
  local_d8._4_4_ = 0;
  local_d8._0_4_ = bottom_top_blob->w;
  local_1a8 = (Mat *)(ulong)(uint)bottom_top_blob->h;
  ppp_Var24 = (_func_int ***)bottom_top_blob->elemsize;
  local_128.cstep = 0;
  local_128.data = (Allocator *)0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_128.elempack = 0;
  local_d8._8_24_ = auVar4._8_24_;
  local_1a0 = (LRN_x86_fma *)CONCAT44(local_1a0._4_4_,bottom_top_blob->c);
  local_128.allocator = (Allocator *)local_128.data;
  local_128.dims = (int)local_128.refcount;
  local_128.w = local_128.refcount._4_4_;
  local_128._48_8_ = local_128.elemsize;
  local_128.c = local_128.elempack;
  Mat::create(&local_128,bottom_top_blob->w,bottom_top_blob->h,bottom_top_blob->c,(size_t)ppp_Var24,
              opt->workspace_allocator);
  iVar27 = -100;
  if (((Allocator *)local_128.data == (Allocator *)0x0) ||
     ((long)local_128.c * local_128.cstep == 0)) goto LAB_002ee8a3;
  local_138._0_8_ = opt;
  iVar31 = local_d8._0_4_;
  local_80 = (long)iVar31;
  iVar27 = (int)local_1a8 * iVar31;
  pMVar13 = (Mat *)0x0;
  local_150 = (Mat *)0x0;
  if (0 < (int)local_1a0) {
    local_150 = (Mat *)((ulong)local_1a0 & 0xffffffff);
  }
  for (; pMVar13 != local_150; pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
    pvVar29 = bottom_top_blob->data;
    sVar1 = bottom_top_blob->elemsize;
    sVar2 = bottom_top_blob->cstep;
    pfVar25 = (float *)(sVar2 * (long)pMVar13 * sVar1 + (long)pvVar29);
    ppp_Var26 = (_func_int ***)
                ((long)(_func_int ***)local_128.data +
                local_128.cstep * (long)pMVar13 * local_128.elemsize);
    lVar20 = 0;
    for (iVar30 = 0; iVar30 + 7 < iVar27; iVar30 = iVar30 + 8) {
      auVar4._4_4_ = pfVar25[1] * pfVar25[1];
      auVar4._0_4_ = *pfVar25 * *pfVar25;
      auVar4._8_4_ = pfVar25[2] * pfVar25[2];
      auVar4._12_4_ = pfVar25[3] * pfVar25[3];
      auVar4._16_4_ = pfVar25[4] * pfVar25[4];
      auVar4._20_4_ = pfVar25[5] * pfVar25[5];
      auVar4._24_4_ = pfVar25[6] * pfVar25[6];
      auVar4._28_4_ = pfVar25[7];
      *(undefined1 (*) [32])ppp_Var26 = auVar4;
      pfVar25 = pfVar25 + 8;
      ppp_Var26 = ppp_Var26 + 4;
      lVar20 = lVar20 + 8;
    }
    for (; (int)lVar20 < iVar27; lVar20 = lVar20 + 1) {
      fVar32 = *(float *)((long)pvVar29 + lVar20 * 4 + sVar2 * sVar1 * (long)pMVar13);
      *(float *)((long)(_func_int ***)local_128.data +
                lVar20 * 4 + local_128.cstep * local_128.elemsize * (long)pMVar13) = fVar32 * fVar32
      ;
    }
  }
  iVar30 = (this->super_LRN).region_type;
  local_148 = ppp_Var24;
  if (iVar30 == 0) {
    local_198.cstep = 0;
    local_198.data = (Allocator *)0x0;
    local_198.refcount._0_4_ = 0;
    local_198.refcount._4_4_ = 0;
    local_198.elemsize._0_4_ = 0;
    local_198.elemsize._4_4_ = 0;
    local_198.elempack = 0;
    local_198.allocator = (Allocator *)0x0;
    local_198.dims = 0;
    local_198.w = 0;
    local_198.h = 0;
    local_198.d = 0;
    local_198.c = 0;
    Mat::create(&local_198,iVar31,(int)local_1a8,(int)local_1a0,(size_t)ppp_Var24,
                opt->workspace_allocator);
    if (((Allocator *)local_198.data == (Allocator *)0x0) ||
       (local_198.cstep * (long)local_198.c == 0)) {
      piVar11 = (int *)CONCAT44(local_198.refcount._4_4_,(int)local_198.refcount);
      iVar27 = -100;
      if (piVar11 == (int *)0x0) goto LAB_002ee8a3;
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 != 0) goto LAB_002ee8a3;
      if (local_198.allocator != (Allocator *)0x0) {
        (*(local_198.allocator)->_vptr_Allocator[3])();
        goto LAB_002ee8a3;
      }
LAB_002ee8f7:
      iVar27 = -100;
      free(local_198.data);
      goto LAB_002ee8a3;
    }
    uVar28 = (int)local_198.cstep * local_198.c;
    uVar17 = 0;
    uVar16 = (ulong)uVar28;
    if ((int)uVar28 < 1) {
      uVar16 = uVar17;
    }
    for (; (int)uVar16 != (int)uVar17; uVar17 = uVar17 + 1) {
      *(undefined4 *)((long)(_func_int ***)local_198.data + uVar17 * 4) = 0;
    }
    local_138._0_4_ = (this->super_LRN).alpha / (float)(this->super_LRN).local_size;
    local_138._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar44 = vshufps_avx(local_138,local_138,0);
    local_d8._16_16_ = auVar44;
    local_d8._0_16_ = auVar44;
    local_140 = bottom_top_blob;
    for (pMVar13 = (Mat *)0x0; pvVar29 = local_198.data, pMVar13 != local_150;
        pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
      iVar31 = (this->super_LRN).local_size;
      for (uVar28 = iVar31 / -2 + (int)pMVar13; (int)uVar28 <= iVar31 / 2 + (int)pMVar13;
          uVar28 = uVar28 + 1) {
        if ((int)uVar28 < (int)local_1a0 && -1 < (int)uVar28) {
          ppp_Var26 = (_func_int ***)
                      ((long)(_func_int ***)local_128.data +
                      local_128.cstep * uVar28 * local_128.elemsize);
          lVar22 = local_198.cstep * (long)pMVar13 *
                   CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
          ppp_Var24 = (_func_int ***)((long)(_func_int ***)local_198.data + lVar22);
          lVar20 = 0;
          for (iVar31 = 0; iVar31 + 7 < iVar27; iVar31 = iVar31 + 8) {
            auVar33._0_4_ = *(float *)ppp_Var24 + *(float *)ppp_Var26;
            auVar33._4_4_ = *(float *)((long)ppp_Var24 + 4) + *(float *)((long)ppp_Var26 + 4);
            auVar33._8_4_ = *(float *)(ppp_Var24 + 1) + *(float *)(ppp_Var26 + 1);
            auVar33._12_4_ =
                 *(float *)((long)(ppp_Var24 + 1) + 4) + *(float *)((long)(ppp_Var26 + 1) + 4);
            auVar33._16_4_ = *(float *)(ppp_Var24 + 2) + *(float *)(ppp_Var26 + 2);
            auVar33._20_4_ =
                 *(float *)((long)(ppp_Var24 + 2) + 4) + *(float *)((long)(ppp_Var26 + 2) + 4);
            auVar33._24_4_ = *(float *)(ppp_Var24 + 3) + *(float *)(ppp_Var26 + 3);
            auVar33._28_4_ =
                 *(float *)((long)(ppp_Var24 + 3) + 4) + *(float *)((long)(ppp_Var26 + 3) + 4);
            *(undefined1 (*) [32])ppp_Var24 = auVar33;
            ppp_Var26 = ppp_Var26 + 4;
            ppp_Var24 = ppp_Var24 + 4;
            lVar20 = lVar20 + 8;
          }
          for (; (int)lVar20 < iVar27; lVar20 = lVar20 + 1) {
            *(float *)((long)(_func_int ***)local_198.data + lVar20 * 4 + lVar22) =
                 *(float *)((long)(_func_int ***)local_198.data + lVar20 * 4 + lVar22) +
                 *(float *)((long)(_func_int ***)local_128.data +
                           lVar20 * 4 + local_128.cstep * local_128.elemsize * (ulong)uVar28);
          }
          iVar31 = (this->super_LRN).local_size;
        }
      }
      pvVar3 = local_140->data;
      sVar1 = local_140->elemsize;
      sVar2 = local_140->cstep;
      pauVar23 = (undefined1 (*) [32])(sVar2 * (long)pMVar13 * sVar1 + (long)pvVar3);
      ppp_Var24 = (_func_int ***)
                  ((long)(_func_int ***)local_198.data +
                  local_198.cstep * (long)pMVar13 *
                  CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize));
      fVar32 = (this->super_LRN).bias;
      auVar34._4_4_ = fVar32;
      auVar34._0_4_ = fVar32;
      auVar34._8_4_ = fVar32;
      auVar34._12_4_ = fVar32;
      auVar34._16_4_ = fVar32;
      auVar34._20_4_ = fVar32;
      auVar34._24_4_ = fVar32;
      auVar34._28_4_ = fVar32;
      fVar32 = (this->super_LRN).beta;
      uVar16 = CONCAT44(fVar32,fVar32) ^ 0x8000000080000000;
      lVar20 = 0;
      for (iVar31 = 0; iVar31 + 7 < iVar27; iVar31 = iVar31 + 8) {
        auVar8 = vfmadd132ps_fma(*(undefined1 (*) [32])ppp_Var24,auVar34,local_d8);
        auVar36._8_4_ = 0x800000;
        auVar36._0_8_ = 0x80000000800000;
        auVar36._12_4_ = 0x800000;
        auVar36._16_4_ = 0x800000;
        auVar36._20_4_ = 0x800000;
        auVar36._24_4_ = 0x800000;
        auVar36._28_4_ = 0x800000;
        auVar4 = vmaxps_avx(ZEXT1632(auVar8),auVar36);
        auVar41 = vpsrld_avx(auVar4._0_16_,0x17);
        auVar44 = vpsrld_avx(auVar4._16_16_,0x17);
        auVar48._8_4_ = 0x807fffff;
        auVar48._0_8_ = 0x807fffff807fffff;
        auVar48._12_4_ = 0x807fffff;
        auVar48._16_4_ = 0x807fffff;
        auVar48._20_4_ = 0x807fffff;
        auVar48._24_4_ = 0x807fffff;
        auVar48._28_4_ = 0x807fffff;
        auVar4 = vandps_avx(auVar4,auVar48);
        auVar67._8_4_ = 0x3f000000;
        auVar67._0_8_ = 0x3f0000003f000000;
        auVar67._12_4_ = 0x3f000000;
        auVar67._16_4_ = 0x3f000000;
        auVar67._20_4_ = 0x3f000000;
        auVar67._24_4_ = 0x3f000000;
        auVar67._28_4_ = 0x3f000000;
        auVar7 = vorps_avx(auVar67,auVar4);
        auVar49._8_4_ = 0x3f3504f3;
        auVar49._0_8_ = 0x3f3504f33f3504f3;
        auVar49._12_4_ = 0x3f3504f3;
        auVar49._16_4_ = 0x3f3504f3;
        auVar49._20_4_ = 0x3f3504f3;
        auVar49._24_4_ = 0x3f3504f3;
        auVar49._28_4_ = 0x3f3504f3;
        auVar33 = vcmpps_avx(auVar49,auVar7,2);
        auVar4 = vandnps_avx(auVar33,auVar7);
        auVar37._0_4_ = auVar7._0_4_ + -1.0 + auVar4._0_4_;
        auVar37._4_4_ = auVar7._4_4_ + -1.0 + auVar4._4_4_;
        auVar37._8_4_ = auVar7._8_4_ + -1.0 + auVar4._8_4_;
        auVar37._12_4_ = auVar7._12_4_ + -1.0 + auVar4._12_4_;
        auVar37._16_4_ = auVar7._16_4_ + -1.0 + auVar4._16_4_;
        auVar37._20_4_ = auVar7._20_4_ + -1.0 + auVar4._20_4_;
        auVar37._24_4_ = auVar7._24_4_ + -1.0 + auVar4._24_4_;
        auVar37._28_4_ = auVar7._28_4_ + -1.0 + auVar4._28_4_;
        auVar44 = vpsubd_avx(auVar44,auVar33._16_16_);
        auVar57._8_4_ = 0xffffff81;
        auVar57._0_8_ = 0xffffff81ffffff81;
        auVar57._12_4_ = 0xffffff81;
        auVar44 = vpaddd_avx(auVar44,auVar57);
        auVar41 = vpsubd_avx(auVar41,auVar33._0_16_);
        auVar41 = vpaddd_avx(auVar41,auVar57);
        auVar43._16_16_ = auVar44;
        auVar43._0_16_ = auVar41;
        auVar45._0_4_ = auVar37._0_4_ * auVar37._0_4_;
        auVar45._4_4_ = auVar37._4_4_ * auVar37._4_4_;
        auVar45._8_4_ = auVar37._8_4_ * auVar37._8_4_;
        auVar45._12_4_ = auVar37._12_4_ * auVar37._12_4_;
        auVar45._16_4_ = auVar37._16_4_ * auVar37._16_4_;
        auVar45._20_4_ = auVar37._20_4_ * auVar37._20_4_;
        auVar45._24_4_ = auVar37._24_4_ * auVar37._24_4_;
        auVar45._28_4_ = 0;
        auVar50._8_4_ = 0x3d9021bb;
        auVar50._0_8_ = 0x3d9021bb3d9021bb;
        auVar50._12_4_ = 0x3d9021bb;
        auVar50._16_4_ = 0x3d9021bb;
        auVar50._20_4_ = 0x3d9021bb;
        auVar50._24_4_ = 0x3d9021bb;
        auVar50._28_4_ = 0x3d9021bb;
        auVar58._8_4_ = 0xbdebd1b8;
        auVar58._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar58._12_4_ = 0xbdebd1b8;
        auVar58._16_4_ = 0xbdebd1b8;
        auVar58._20_4_ = 0xbdebd1b8;
        auVar58._24_4_ = 0xbdebd1b8;
        auVar58._28_4_ = 0xbdebd1b8;
        auVar44 = vfmadd213ps_fma(auVar50,auVar37,auVar58);
        auVar59._8_4_ = 0x3def251a;
        auVar59._0_8_ = 0x3def251a3def251a;
        auVar59._12_4_ = 0x3def251a;
        auVar59._16_4_ = 0x3def251a;
        auVar59._20_4_ = 0x3def251a;
        auVar59._24_4_ = 0x3def251a;
        auVar59._28_4_ = 0x3def251a;
        auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar37,auVar59);
        auVar60._8_4_ = 0xbdfe5d4f;
        auVar60._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar60._12_4_ = 0xbdfe5d4f;
        auVar60._16_4_ = 0xbdfe5d4f;
        auVar60._20_4_ = 0xbdfe5d4f;
        auVar60._24_4_ = 0xbdfe5d4f;
        auVar60._28_4_ = 0xbdfe5d4f;
        auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar37,auVar60);
        auVar61._8_4_ = 0x3e11e9bf;
        auVar61._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar61._12_4_ = 0x3e11e9bf;
        auVar61._16_4_ = 0x3e11e9bf;
        auVar61._20_4_ = 0x3e11e9bf;
        auVar61._24_4_ = 0x3e11e9bf;
        auVar61._28_4_ = 0x3e11e9bf;
        auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar37,auVar61);
        auVar62._8_4_ = 0xbe2aae50;
        auVar62._0_8_ = 0xbe2aae50be2aae50;
        auVar62._12_4_ = 0xbe2aae50;
        auVar62._16_4_ = 0xbe2aae50;
        auVar62._20_4_ = 0xbe2aae50;
        auVar62._24_4_ = 0xbe2aae50;
        auVar62._28_4_ = 0xbe2aae50;
        auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar37,auVar62);
        auVar63._8_4_ = 0x3e4cceac;
        auVar63._0_8_ = 0x3e4cceac3e4cceac;
        auVar63._12_4_ = 0x3e4cceac;
        auVar63._16_4_ = 0x3e4cceac;
        auVar63._20_4_ = 0x3e4cceac;
        auVar63._24_4_ = 0x3e4cceac;
        auVar63._28_4_ = 0x3e4cceac;
        auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar37,auVar63);
        auVar64._8_4_ = 0xbe7ffffc;
        auVar64._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar64._12_4_ = 0xbe7ffffc;
        auVar64._16_4_ = 0xbe7ffffc;
        auVar64._20_4_ = 0xbe7ffffc;
        auVar64._24_4_ = 0xbe7ffffc;
        auVar64._28_4_ = 0xbe7ffffc;
        auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar37,auVar64);
        auVar65._8_4_ = 0x3eaaaaaa;
        auVar65._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar65._12_4_ = 0x3eaaaaaa;
        auVar65._16_4_ = 0x3eaaaaaa;
        auVar65._20_4_ = 0x3eaaaaaa;
        auVar65._24_4_ = 0x3eaaaaaa;
        auVar65._28_4_ = 0x3eaaaaaa;
        auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar37,auVar65);
        auVar51._0_4_ = auVar45._0_4_ * auVar37._0_4_ * auVar44._0_4_;
        auVar51._4_4_ = auVar45._4_4_ * auVar37._4_4_ * auVar44._4_4_;
        auVar51._8_4_ = auVar45._8_4_ * auVar37._8_4_ * auVar44._8_4_;
        auVar51._12_4_ = auVar45._12_4_ * auVar37._12_4_ * auVar44._12_4_;
        auVar51._16_4_ = auVar45._16_4_ * auVar37._16_4_ * 0.0;
        auVar51._20_4_ = auVar45._20_4_ * auVar37._20_4_ * 0.0;
        auVar51._24_4_ = auVar45._24_4_ * auVar37._24_4_ * 0.0;
        auVar51._28_4_ = 0;
        auVar33 = vcvtdq2ps_avx(auVar43);
        auVar66._8_4_ = 0xb95e8083;
        auVar66._0_8_ = 0xb95e8083b95e8083;
        auVar66._12_4_ = 0xb95e8083;
        auVar66._16_4_ = 0xb95e8083;
        auVar66._20_4_ = 0xb95e8083;
        auVar66._24_4_ = 0xb95e8083;
        auVar66._28_4_ = 0xb95e8083;
        auVar44 = vfmadd231ps_fma(auVar51,auVar33,auVar66);
        auVar44 = vfmsub231ps_fma(ZEXT1632(auVar44),auVar67,auVar45);
        auVar4 = vcmpps_avx(ZEXT1632(auVar8),_DAT_0053ad40,2);
        auVar7 = vsubps_avx(ZEXT1632(auVar44),auVar37);
        auVar46._8_4_ = 0x3f318000;
        auVar46._0_8_ = 0x3f3180003f318000;
        auVar46._12_4_ = 0x3f318000;
        auVar46._16_4_ = 0x3f318000;
        auVar46._20_4_ = 0x3f318000;
        auVar46._24_4_ = 0x3f318000;
        auVar46._28_4_ = 0x3f318000;
        auVar44 = vfmsub231ps_fma(auVar7,auVar46,auVar33);
        auVar4 = vorps_avx(auVar4,ZEXT1632(auVar44));
        fVar5 = (float)uVar16;
        fVar6 = (float)(uVar16 >> 0x20);
        auVar7._4_4_ = auVar4._4_4_ * fVar6;
        auVar7._0_4_ = auVar4._0_4_ * fVar5;
        auVar7._8_4_ = auVar4._8_4_ * -fVar32;
        auVar7._12_4_ = auVar4._12_4_ * -fVar32;
        auVar7._16_4_ = auVar4._16_4_ * fVar5;
        auVar7._20_4_ = auVar4._20_4_ * fVar6;
        auVar7._24_4_ = auVar4._24_4_ * -fVar32;
        auVar7._28_4_ = auVar4._28_4_;
        auVar38._8_4_ = 0x42b0c0a5;
        auVar38._0_8_ = 0x42b0c0a542b0c0a5;
        auVar38._12_4_ = 0x42b0c0a5;
        auVar38._16_4_ = 0x42b0c0a5;
        auVar38._20_4_ = 0x42b0c0a5;
        auVar38._24_4_ = 0x42b0c0a5;
        auVar38._28_4_ = 0x42b0c0a5;
        auVar4 = vminps_avx(auVar7,auVar38);
        auVar39._8_4_ = 0xc2b0c0a5;
        auVar39._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar39._12_4_ = 0xc2b0c0a5;
        auVar39._16_4_ = 0xc2b0c0a5;
        auVar39._20_4_ = 0xc2b0c0a5;
        auVar39._24_4_ = 0xc2b0c0a5;
        auVar39._28_4_ = 0xc2b0c0a5;
        auVar33 = vmaxps_avx(auVar4,auVar39);
        auVar40._8_4_ = 0x3fb8aa3b;
        auVar40._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar40._12_4_ = 0x3fb8aa3b;
        auVar40._16_4_ = 0x3fb8aa3b;
        auVar40._20_4_ = 0x3fb8aa3b;
        auVar40._24_4_ = 0x3fb8aa3b;
        auVar40._28_4_ = 0x3fb8aa3b;
        auVar44 = vfmadd213ps_fma(auVar40,auVar33,auVar67);
        auVar7 = vroundps_avx(ZEXT1632(auVar44),1);
        auVar4 = vcmpps_avx(ZEXT1632(auVar44),auVar7,1);
        auVar52._8_4_ = 0x3f800000;
        auVar52._0_8_ = 0x3f8000003f800000;
        auVar52._12_4_ = 0x3f800000;
        auVar52._16_4_ = 0x3f800000;
        auVar52._20_4_ = 0x3f800000;
        auVar52._24_4_ = 0x3f800000;
        auVar52._28_4_ = 0x3f800000;
        auVar4 = vandps_avx(auVar4,auVar52);
        auVar4 = vsubps_avx(auVar7,auVar4);
        auVar44 = vfmsub231ps_fma(auVar33,auVar4,auVar46);
        auVar41 = vfnmsub231ps_fma(ZEXT1632(auVar44),auVar4,auVar66);
        auVar33 = ZEXT1632(auVar41);
        auVar9._28_4_ = auVar7._28_4_;
        auVar9._0_28_ =
             ZEXT1628(CONCAT412(auVar41._12_4_ * auVar41._12_4_,
                                CONCAT48(auVar41._8_4_ * auVar41._8_4_,
                                         CONCAT44(auVar41._4_4_ * auVar41._4_4_,
                                                  auVar41._0_4_ * auVar41._0_4_))));
        auVar47._8_4_ = 0x39506967;
        auVar47._0_8_ = 0x3950696739506967;
        auVar47._12_4_ = 0x39506967;
        auVar47._16_4_ = 0x39506967;
        auVar47._20_4_ = 0x39506967;
        auVar47._24_4_ = 0x39506967;
        auVar47._28_4_ = 0x39506967;
        auVar53._8_4_ = 0x3ab743ce;
        auVar53._0_8_ = 0x3ab743ce3ab743ce;
        auVar53._12_4_ = 0x3ab743ce;
        auVar53._16_4_ = 0x3ab743ce;
        auVar53._20_4_ = 0x3ab743ce;
        auVar53._24_4_ = 0x3ab743ce;
        auVar53._28_4_ = 0x3ab743ce;
        auVar44 = vfmadd213ps_fma(auVar47,auVar33,auVar53);
        auVar54._8_4_ = 0x3c088908;
        auVar54._0_8_ = 0x3c0889083c088908;
        auVar54._12_4_ = 0x3c088908;
        auVar54._16_4_ = 0x3c088908;
        auVar54._20_4_ = 0x3c088908;
        auVar54._24_4_ = 0x3c088908;
        auVar54._28_4_ = 0x3c088908;
        auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar33,auVar54);
        auVar55._8_4_ = 0x3d2aa9c1;
        auVar55._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar55._12_4_ = 0x3d2aa9c1;
        auVar55._16_4_ = 0x3d2aa9c1;
        auVar55._20_4_ = 0x3d2aa9c1;
        auVar55._24_4_ = 0x3d2aa9c1;
        auVar55._28_4_ = 0x3d2aa9c1;
        auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar33,auVar55);
        auVar56._8_4_ = 0x3e2aaaaa;
        auVar56._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar56._12_4_ = 0x3e2aaaaa;
        auVar56._16_4_ = 0x3e2aaaaa;
        auVar56._20_4_ = 0x3e2aaaaa;
        auVar56._24_4_ = 0x3e2aaaaa;
        auVar56._28_4_ = 0x3e2aaaaa;
        auVar33 = ZEXT1632(auVar41);
        auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar33,auVar56);
        auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar33,auVar67);
        auVar8 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar9,auVar33);
        auVar44._0_4_ = (int)auVar4._0_4_;
        auVar44._4_4_ = (int)auVar4._4_4_;
        auVar44._8_4_ = (int)auVar4._8_4_;
        auVar44._12_4_ = (int)auVar4._12_4_;
        auVar35._16_4_ = (int)auVar4._16_4_;
        auVar35._0_16_ = auVar44;
        auVar35._20_4_ = (int)auVar4._20_4_;
        auVar35._24_4_ = (int)auVar4._24_4_;
        auVar35._28_4_ = (int)auVar4._28_4_;
        auVar41 = vpslld_avx(auVar44,0x17);
        auVar44 = vpslld_avx(auVar35._16_16_,0x17);
        auVar42._8_4_ = 0x3f800000;
        auVar42._0_8_ = 0x3f8000003f800000;
        auVar42._12_4_ = 0x3f800000;
        auVar44 = vpaddd_avx(auVar44,auVar42);
        auVar41 = vpaddd_avx(auVar41,auVar42);
        auVar10._4_4_ = auVar41._4_4_ * *(float *)((long)*pauVar23 + 4);
        auVar10._0_4_ = auVar41._0_4_ * *(float *)*pauVar23;
        auVar10._8_4_ = auVar41._8_4_ * *(float *)((long)*pauVar23 + 8);
        auVar10._12_4_ = auVar41._12_4_ * *(float *)((long)*pauVar23 + 0xc);
        auVar10._16_4_ = auVar44._0_4_ * *(float *)((long)*pauVar23 + 0x10);
        auVar10._20_4_ = auVar44._4_4_ * *(float *)((long)*pauVar23 + 0x14);
        auVar10._24_4_ = auVar44._8_4_ * *(float *)((long)*pauVar23 + 0x18);
        auVar10._28_4_ = auVar44._12_4_;
        auVar44 = vfmadd213ps_fma(auVar10,ZEXT1632(auVar8),auVar10);
        *pauVar23 = ZEXT1632(auVar44);
        ppp_Var24 = ppp_Var24 + 4;
        pauVar23 = pauVar23 + 1;
        lVar20 = lVar20 + 8;
      }
      lVar22 = sVar2 * sVar1 * (long)pMVar13;
      lVar18 = local_198.cstep * CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
      for (; (int)lVar20 < iVar27; lVar20 = lVar20 + 1) {
        auVar44 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)(_func_int ***)pvVar29 +
                                                   lVar20 * 4 + lVar18 * (long)pMVar13)),local_138,
                                  ZEXT416((uint)(this->super_LRN).bias));
        fVar32 = powf(auVar44._0_4_,-(this->super_LRN).beta);
        *(float *)((long)pvVar3 + lVar20 * 4 + lVar22) =
             fVar32 * *(float *)((long)pvVar3 + lVar20 * 4 + lVar22);
      }
    }
    piVar11 = (int *)CONCAT44(local_198.refcount._4_4_,(int)local_198.refcount);
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_198.allocator == (Allocator *)0x0) goto LAB_002ee896;
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  else {
    iVar27 = 0;
    if (iVar30 != 1) goto LAB_002ee8a3;
    piVar11 = (int *)CONCAT44(local_128.refcount._4_4_,(int)local_128.refcount);
    local_198.data = local_128.data;
    local_198.refcount._0_4_ = (int)local_128.refcount;
    local_198.refcount._4_4_ = local_128.refcount._4_4_;
    local_198.elemsize._0_4_ = (undefined4)local_128.elemsize;
    local_198.elemsize._4_4_ = (undefined4)(local_128.elemsize >> 0x20);
    local_198.elempack = local_128.elempack;
    local_198.allocator = local_128.allocator;
    local_198.dims = local_128.dims;
    local_198.w = local_128.w;
    local_198.h = local_128.h;
    local_198.d = local_128.d;
    local_198.c = local_128.c;
    local_198.cstep = local_128.cstep;
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + 1;
      UNLOCK();
    }
    uVar28 = (this->super_LRN).local_size;
    if (1 < (int)uVar28) {
      top = uVar28 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border(&local_128,&local_198,top,~top + uVar28,top,~top + uVar28,0,0.0,
                       (Option *)&_space_ofs);
      iVar27 = -100;
      if (((Allocator *)local_198.data == (Allocator *)0x0) ||
         ((long)local_198.c * local_198.cstep == 0)) {
        piVar11 = (int *)CONCAT44(local_198.refcount._4_4_,(int)local_198.refcount);
        if (piVar11 == (int *)0x0) goto LAB_002ee8a3;
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 != 0) goto LAB_002ee8a3;
        if (local_198.allocator != (Allocator *)0x0) {
          (*(local_198.allocator)->_vptr_Allocator[3])();
          goto LAB_002ee8a3;
        }
        goto LAB_002ee8f7;
      }
      uVar28 = (this->super_LRN).local_size;
      iVar31 = local_198.w;
    }
    uVar28 = uVar28 * uVar28;
    local_138._0_4_ = (this->super_LRN).alpha;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar28,&local_1a9);
    piVar12 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar27 = (this->super_LRN).local_size;
    iVar31 = iVar31 - iVar27;
    lVar20 = 0;
    iVar30 = 0;
    for (iVar19 = 0; iVar19 < iVar27; iVar19 = iVar19 + 1) {
      for (lVar22 = 0; iVar21 = (int)lVar22, iVar21 < iVar27; lVar22 = lVar22 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar20 + lVar22] = iVar30 + iVar21;
        iVar27 = (this->super_LRN).local_size;
      }
      iVar30 = iVar30 + iVar31 + iVar21;
      lVar20 = (int)lVar20 + lVar22;
    }
    local_98 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
    local_a0 = local_198.cstep * CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize);
    local_88 = (long)local_198.w * CONCAT44(local_198.elemsize._4_4_,(undefined4)local_198.elemsize)
    ;
    pMVar15 = (Mat *)0x0;
    pMVar13 = (Mat *)(local_d8._0_8_ & 0xffffffff);
    if (local_d8._0_4_ < 1) {
      pMVar13 = pMVar15;
    }
    local_a8 = bottom_top_blob->data;
    iVar27 = (int)local_1a8;
    local_1a8 = (Mat *)((ulong)local_1a8 & 0xffffffff);
    if (iVar27 < 1) {
      local_1a8 = pMVar15;
    }
    local_b0 = (Allocator *)local_198.data;
    local_d8._0_4_ = 1.0 / (float)(int)uVar28;
    local_1a0 = this;
    while (pMVar15 != local_150) {
      pvVar29 = (void *)(local_98 * (long)pMVar15 + (long)local_a8);
      local_148 = (_func_int ***)((long)&local_b0->_vptr_Allocator + local_a0 * (long)pMVar15);
      pMVar14 = (Mat *)0x0;
      local_90 = pMVar15;
      while (ppp_Var24 = local_148, pMVar14 != local_1a8) {
        lVar20 = local_88 * (long)pMVar14;
        local_140 = pMVar14;
        for (pMVar15 = (Mat *)0x0; pMVar15 != pMVar13; pMVar15 = (Mat *)((long)&pMVar15->data + 1))
        {
          fVar32 = 0.0;
          for (uVar16 = 0; uVar28 != uVar16; uVar16 = uVar16 + 1) {
            fVar32 = fVar32 + *(float *)((long)ppp_Var24 +
                                        (long)piVar12[uVar16] * 4 + (long)pMVar15 * 4 + lVar20);
          }
          auVar44 = vfmadd213ss_fma(ZEXT416((uint)(fVar32 * (float)local_138._0_4_)),
                                    ZEXT416((uint)local_d8._0_4_),
                                    ZEXT416((uint)(local_1a0->super_LRN).bias));
          fVar32 = powf(auVar44._0_4_,-(local_1a0->super_LRN).beta);
          *(float *)((long)pvVar29 + (long)pMVar15 * 4) =
               fVar32 * *(float *)((long)pvVar29 + (long)pMVar15 * 4);
        }
        pvVar29 = (void *)((long)pvVar29 + local_80 * 4);
        pMVar14 = (Mat *)((long)&local_140->data + 1);
      }
      pMVar15 = (Mat *)((long)&local_90->data + 1);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    piVar11 = (int *)CONCAT44(local_198.refcount._4_4_,(int)local_198.refcount);
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
LAB_002ee896:
          free(local_198.data);
        }
        else {
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  iVar27 = 0;
LAB_002ee8a3:
  piVar11 = (int *)CONCAT44(local_128.refcount._4_4_,(int)local_128.refcount);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        free(local_128.data);
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar27;
}

Assistant:

int LRN_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * powf(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}